

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

_Bool bitset_container_intersect(bitset_container_t *src_1,bitset_container_t *src_2)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((*src_1->words & *src_2->words) != 0) {
    return true;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0x3ff) break;
    uVar1 = uVar2 + 1;
  } while ((src_1->words[uVar2 + 1] & src_2->words[uVar2 + 1]) == 0);
  return uVar2 < 0x3ff;
}

Assistant:

bool bitset_container_intersect(const bitset_container_t *src_1,
                                const bitset_container_t *src_2) {
    // could vectorize, but this is probably already quite fast in practice
    const uint64_t *__restrict__ words_1 = src_1->words;
    const uint64_t *__restrict__ words_2 = src_2->words;
    for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; i++) {
        if ((words_1[i] & words_2[i]) != 0) return true;
    }
    return false;
}